

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::ByteSizeLong(VisionFeaturePrint *this)

{
  bool bVar1;
  VisionFeaturePrintTypeCase VVar2;
  int size;
  long lVar3;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  VisionFeaturePrint *this_local;
  
  _cached_size = 0;
  VVar2 = VisionFeaturePrintType_case(this);
  if (VVar2 != VISIONFEATUREPRINTTYPE_NOT_SET) {
    if (VVar2 == kScene) {
      _cached_size = google::protobuf::internal::WireFormatLite::
                     MessageSize<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>
                               ((this->VisionFeaturePrintType_).scene_);
      _cached_size = _cached_size + 2;
    }
    else if (VVar2 == kObjects) {
      _cached_size = google::protobuf::internal::WireFormatLite::
                     MessageSize<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>
                               ((this->VisionFeaturePrintType_).objects_);
      _cached_size = _cached_size + 2;
    }
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    _cached_size = lVar3 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t VisionFeaturePrint::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (VisionFeaturePrintType_case()) {
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene scene = 20;
    case kScene: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *VisionFeaturePrintType_.scene_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects objects = 21;
    case kObjects: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *VisionFeaturePrintType_.objects_);
      break;
    }
    case VISIONFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}